

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O2

void findAllTextureWidgetsRecursively(QWidget *tlw,QWidget *widget)

{
  QWidget **ppQVar1;
  bool bVar2;
  QTLWExtra *pQVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  __single_object tl;
  _Head_base<0UL,_QPlatformTextureList_*,_false> local_50;
  QArrayDataPointer<QWidget_*> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(*(long *)&widget->field_0x8 + 0x253) & 2) != 0) {
    local_48.size = 0;
    local_48.d = (Data *)0x0;
    local_48.ptr = (QWidget **)0x0;
    local_50._M_head_impl = (QPlatformTextureList *)&DAT_aaaaaaaaaaaaaaaa;
    std::make_unique<QPlatformTextureList>();
    findTextureWidgetsRecursively(tlw,widget,local_50._M_head_impl,(QList<QWidget_*> *)&local_48);
    bVar2 = QPlatformTextureList::isEmpty(local_50._M_head_impl);
    if (!bVar2) {
      pQVar3 = QWidgetPrivate::topData(*(QWidgetPrivate **)&tlw->field_0x8);
      std::
      vector<std::unique_ptr<QPlatformTextureList,std::default_delete<QPlatformTextureList>>,std::allocator<std::unique_ptr<QPlatformTextureList,std::default_delete<QPlatformTextureList>>>>
      ::
      emplace_back<std::unique_ptr<QPlatformTextureList,std::default_delete<QPlatformTextureList>>>
                ((vector<std::unique_ptr<QPlatformTextureList,std::default_delete<QPlatformTextureList>>,std::allocator<std::unique_ptr<QPlatformTextureList,std::default_delete<QPlatformTextureList>>>>
                  *)&pQVar3->widgetTextures,
                 (unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_> *)
                 &local_50);
    }
    ppQVar1 = local_48.ptr;
    lVar5 = local_48.size << 3;
    for (lVar4 = 0; lVar5 != lVar4; lVar4 = lVar4 + 8) {
      if ((*(byte *)(*(long *)&(*(QWidget **)((long)ppQVar1 + lVar4))->field_0x8 + 0x253) & 2) != 0)
      {
        findAllTextureWidgetsRecursively(tlw,*(QWidget **)((long)ppQVar1 + lVar4));
      }
    }
    if (local_50._M_head_impl != (QPlatformTextureList *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 0x20))();
    }
    QArrayDataPointer<QWidget_*>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void findAllTextureWidgetsRecursively(QWidget *tlw, QWidget *widget)
{
    // textureChildSeen does not take native child widgets into account and that's good.
    if (QWidgetPrivate::get(widget)->textureChildSeen) {
        QList<QWidget *> nativeChildren;
        auto tl = std::make_unique<QPlatformTextureList>();
        // Look for texture widgets (incl. widget itself) from 'widget' down,
        // but skip subtrees with a parent of a native child widget.
        findTextureWidgetsRecursively(tlw, widget, tl.get(), &nativeChildren);
        // tl may be empty regardless of textureChildSeen if we have native or hidden children.
        if (!tl->isEmpty())
            QWidgetPrivate::get(tlw)->topData()->widgetTextures.push_back(std::move(tl));
        // Native child widgets, if there was any, get their own separate QPlatformTextureList.
        for (QWidget *ncw : std::as_const(nativeChildren)) {
            if (QWidgetPrivate::get(ncw)->textureChildSeen)
                findAllTextureWidgetsRecursively(tlw, ncw);
        }
    }
}